

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_qaddsub(DisasContext_conflict1 *s,arg_rrr *a,_Bool add,_Bool doub)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 retval;
  TCGv_i32 retval_00;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGContext_conflict1 *tcg_ctx;
  _Bool doub_local;
  _Bool add_local;
  arg_rrr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    iVar1 = arm_dc_feature(s,0xf);
  }
  else {
    iVar1 = arm_dc_feature(s,0x22);
  }
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else {
    retval = load_reg(s,a->rm);
    retval_00 = load_reg(s,a->rn);
    if (doub) {
      gen_helper_add_saturate(tcg_ctx_00,retval_00,tcg_ctx_00->cpu_env,retval_00,retval_00);
    }
    if (add) {
      gen_helper_add_saturate(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,retval,retval_00);
    }
    else {
      gen_helper_sub_saturate(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,retval,retval_00);
    }
    tcg_temp_free_i32(tcg_ctx_00,retval_00);
    store_reg(s,a->rd,retval);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool op_qaddsub(DisasContext *s, arg_rrr *a, bool add, bool doub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_5TE) {
        return false;
    }

    t0 = load_reg(s, a->rm);
    t1 = load_reg(s, a->rn);
    if (doub) {
        gen_helper_add_saturate(tcg_ctx, t1, tcg_ctx->cpu_env, t1, t1);
    }
    if (add) {
        gen_helper_add_saturate(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1);
    } else {
        gen_helper_sub_saturate(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1);
    }
    tcg_temp_free_i32(tcg_ctx, t1);
    store_reg(s, a->rd, t0);
    return true;
}